

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<8,_8,_16777232,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::InstanceIntersectorKMB<8>_>,_false>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  AABBNodeMB4D *node1;
  ulong uVar10;
  ulong uVar11;
  ulong *puVar12;
  undefined1 (*pauVar13) [32];
  uint uVar14;
  ulong uVar15;
  Primitive *prim;
  bool bVar16;
  bool bVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [16];
  undefined1 auVar20 [64];
  undefined1 auVar21 [32];
  anon_union_32_3_898e2e57_for_vboolf_impl<8>_1 aVar22;
  undefined1 auVar23 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  Precalculations pre;
  vbool<8> valid0;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  Precalculations local_59c1;
  RayK<8> *local_59c0;
  ulong local_59b8;
  ulong local_59b0;
  RayQueryContext *local_59a8;
  undefined1 local_59a0 [32];
  anon_union_32_3_898e2e57_for_vboolf_impl<8>_1 local_5980;
  undefined1 local_5960 [32];
  undefined1 local_5940 [32];
  undefined1 local_5920 [32];
  undefined1 local_5900 [32];
  undefined1 local_58e0 [32];
  float local_58c0;
  float fStack_58bc;
  float fStack_58b8;
  float fStack_58b4;
  float fStack_58b0;
  float fStack_58ac;
  float fStack_58a8;
  undefined4 uStack_58a4;
  float local_58a0;
  float fStack_589c;
  float fStack_5898;
  float fStack_5894;
  float fStack_5890;
  float fStack_588c;
  float fStack_5888;
  undefined4 uStack_5884;
  float local_5880;
  float fStack_587c;
  float fStack_5878;
  float fStack_5874;
  float fStack_5870;
  float fStack_586c;
  float fStack_5868;
  undefined4 uStack_5864;
  undefined1 local_5860 [32];
  anon_union_32_3_898e2e57_for_vboolf_impl<8>_1 local_5840;
  undefined8 local_5810;
  ulong local_5808 [561];
  undefined1 local_4680 [32];
  undefined1 local_4660 [32];
  undefined1 local_4640 [17936];
  undefined1 auVar24 [64];
  undefined1 auVar34 [32];
  
  local_5808[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_5808[0] != 8) {
    auVar18 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
    auVar19 = ZEXT816(0) << 0x40;
    auVar4 = vpcmpeqd_avx2(auVar18,(undefined1  [32])valid_i->field_0);
    auVar18 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar19),5);
    auVar23 = auVar4 & auVar18;
    if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar23 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar23 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar23 >> 0x7f,0) != '\0') ||
          (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar23 >> 0xbf,0) != '\0') ||
        (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar23[0x1f] < '\0')
    {
      auVar18 = vandps_avx(auVar18,auVar4);
      auVar3 = vpackssdw_avx(auVar18._0_16_,auVar18._16_16_);
      auVar30._8_4_ = 0x7fffffff;
      auVar30._0_8_ = 0x7fffffff7fffffff;
      auVar30._12_4_ = 0x7fffffff;
      auVar30._16_4_ = 0x7fffffff;
      auVar30._20_4_ = 0x7fffffff;
      auVar30._24_4_ = 0x7fffffff;
      auVar30._28_4_ = 0x7fffffff;
      auVar33._8_4_ = 0x219392ef;
      auVar33._0_8_ = 0x219392ef219392ef;
      auVar33._12_4_ = 0x219392ef;
      auVar34._16_4_ = 0x219392ef;
      auVar34._0_16_ = auVar33;
      auVar34._20_4_ = 0x219392ef;
      auVar34._24_4_ = 0x219392ef;
      auVar34._28_4_ = 0x219392ef;
      auVar18 = vandps_avx(*(undefined1 (*) [32])(ray + 0x80),auVar30);
      auVar18 = vcmpps_avx(auVar18,auVar34,1);
      auVar23 = vblendvps_avx(*(undefined1 (*) [32])(ray + 0x80),auVar34,auVar18);
      auVar18 = vandps_avx(*(undefined1 (*) [32])(ray + 0xc0),auVar30);
      auVar18 = vcmpps_avx(auVar18,auVar34,1);
      auVar18 = vblendvps_avx(*(undefined1 (*) [32])(ray + 0xc0),auVar34,auVar18);
      auVar4 = vrcpps_avx(auVar23);
      auVar41._8_4_ = 0x3f800000;
      auVar41._0_8_ = &DAT_3f8000003f800000;
      auVar41._12_4_ = 0x3f800000;
      auVar41._16_4_ = 0x3f800000;
      auVar41._20_4_ = 0x3f800000;
      auVar41._24_4_ = 0x3f800000;
      auVar41._28_4_ = 0x3f800000;
      auVar5 = vfnmadd213ps_fma(auVar23,auVar4,auVar41);
      auVar21 = vrcpps_avx(auVar18);
      auVar6 = vfnmadd213ps_fma(auVar18,auVar21,auVar41);
      auVar18 = vandps_avx(*(undefined1 (*) [32])(ray + 0xa0),auVar30);
      auVar18 = vcmpps_avx(auVar18,auVar34,1);
      auVar18 = vblendvps_avx(*(undefined1 (*) [32])(ray + 0xa0),auVar34,auVar18);
      auVar23 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),ZEXT1632(auVar19));
      local_58e0 = vpmovsxwd_avx2(auVar3);
      auVar33 = vpcmpeqd_avx(auVar33,auVar33);
      auVar30 = vrcpps_avx(auVar18);
      auVar7 = vfnmadd213ps_fma(auVar18,auVar30,auVar41);
      local_4680._8_4_ = 0x7f800000;
      local_4680._0_8_ = 0x7f8000007f800000;
      local_4680._12_4_ = 0x7f800000;
      local_4680._16_4_ = 0x7f800000;
      local_4680._20_4_ = 0x7f800000;
      local_4680._24_4_ = 0x7f800000;
      local_4680._28_4_ = 0x7f800000;
      local_5860 = vblendvps_avx(local_4680,auVar23,local_58e0);
      local_59c0 = ray + 0x100;
      auVar7 = vfmadd132ps_fma(ZEXT1632(auVar7),auVar30,auVar30);
      auVar47 = ZEXT1664(auVar7);
      auVar30 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar19));
      auVar18 = *(undefined1 (*) [32])ray;
      auVar19 = vfmadd132ps_fma(ZEXT1632(auVar5),auVar4,auVar4);
      auVar45 = ZEXT1664(auVar19);
      auVar23 = *(undefined1 (*) [32])(ray + 0x20);
      auVar4 = *(undefined1 (*) [32])(ray + 0x40);
      local_59a0 = vpmovsxwd_avx2(auVar3 ^ auVar33);
      auVar3 = vfmadd132ps_fma(ZEXT1632(auVar6),auVar21,auVar21);
      auVar46 = ZEXT1664(auVar3);
      auVar21._8_4_ = 0xff800000;
      auVar21._0_8_ = 0xff800000ff800000;
      auVar21._12_4_ = 0xff800000;
      auVar21._16_4_ = 0xff800000;
      auVar21._20_4_ = 0xff800000;
      auVar21._24_4_ = 0xff800000;
      auVar21._28_4_ = 0xff800000;
      auVar24 = ZEXT3264(auVar21);
      auVar21 = vblendvps_avx(auVar21,auVar30,local_58e0);
      auVar44 = ZEXT3264(auVar21);
      puVar12 = local_5808 + 1;
      local_5810 = 0xfffffffffffffff8;
      pauVar13 = (undefined1 (*) [32])local_4640;
      local_4660 = local_5860;
      local_5880 = auVar19._0_4_ * -auVar18._0_4_;
      fStack_587c = auVar19._4_4_ * -auVar18._4_4_;
      fStack_5878 = auVar19._8_4_ * -auVar18._8_4_;
      fStack_5874 = auVar19._12_4_ * -auVar18._12_4_;
      fStack_5870 = -auVar18._16_4_ * 0.0;
      fStack_586c = -auVar18._20_4_ * 0.0;
      uStack_58a4 = auVar30._28_4_;
      fStack_5868 = -auVar18._24_4_ * 0.0;
      local_58a0 = auVar7._0_4_ * -auVar23._0_4_;
      fStack_589c = auVar7._4_4_ * -auVar23._4_4_;
      fStack_5898 = auVar7._8_4_ * -auVar23._8_4_;
      fStack_5894 = auVar7._12_4_ * -auVar23._12_4_;
      fStack_5890 = -auVar23._16_4_ * 0.0;
      fStack_588c = -auVar23._20_4_ * 0.0;
      fStack_5888 = -auVar23._24_4_ * 0.0;
      local_58c0 = auVar3._0_4_ * -auVar4._0_4_;
      fStack_58bc = auVar3._4_4_ * -auVar4._4_4_;
      fStack_58b8 = auVar3._8_4_ * -auVar4._8_4_;
      fStack_58b4 = auVar3._12_4_ * -auVar4._12_4_;
      fStack_58b0 = -auVar4._16_4_ * 0.0;
      fStack_58ac = -auVar4._20_4_ * 0.0;
      fStack_58a8 = -auVar4._24_4_ * 0.0;
      local_59a8 = context;
      uStack_5884 = uStack_58a4;
      uStack_5864 = uStack_58a4;
LAB_0069f928:
      pauVar13 = pauVar13 + -1;
      uVar15 = puVar12[-1];
      puVar12 = puVar12 + -1;
      bVar17 = true;
      if (uVar15 != 0xfffffffffffffff8) {
        auVar18 = *pauVar13;
        local_5960 = auVar44._0_32_;
        auVar23 = vcmpps_avx(auVar18,local_5960,1);
        if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar23 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar23 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar23 >> 0x7f,0) != '\0') ||
              (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar23 >> 0xbf,0) != '\0') ||
            (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar23[0x1f] < '\0') {
          do {
            aVar22 = auVar24._0_32_;
            uVar14 = (uint)uVar15;
            local_5900 = auVar45._0_32_;
            local_5940 = auVar47._0_32_;
            local_5920 = auVar46._0_32_;
            if ((uVar15 & 8) != 0) {
              if (uVar15 == 0xfffffffffffffff8) goto LAB_0069fb65;
              auVar18 = vcmpps_avx(local_5960,auVar18,6);
              if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar18 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar18 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar18 >> 0x7f,0) != '\0') ||
                    (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar18 >> 0xbf,0) != '\0') ||
                  (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar18[0x1f] < '\0') {
                auVar18 = vpcmpeqd_avx2(auVar18,auVar18);
                local_59b0 = (ulong)(uVar14 & 0xf) - 8;
                local_5980 = (anon_union_32_3_898e2e57_for_vboolf_impl<8>_1)(auVar18 ^ local_59a0);
                if (local_59b0 == 0) goto LAB_0069fc39;
                prim = (Primitive *)(uVar15 & 0xfffffffffffffff0);
                local_59b8 = 1;
                goto LAB_0069fbdb;
              }
              break;
            }
            uVar10 = uVar15 & 0xfffffffffffffff0;
            auVar20 = ZEXT3264(CONCAT428(0x7f800000,
                                         CONCAT424(0x7f800000,
                                                   CONCAT420(0x7f800000,
                                                             CONCAT416(0x7f800000,
                                                                       CONCAT412(0x7f800000,
                                                                                 CONCAT48(0x7f800000
                                                                                          ,
                                                  0x7f8000007f800000)))))));
            uVar11 = 0;
            uVar15 = 8;
            do {
              uVar2 = *(ulong *)(uVar10 + uVar11 * 8);
              if (uVar2 != 8) {
                uVar1 = *(undefined4 *)(uVar10 + 0x100 + uVar11 * 4);
                auVar27._4_4_ = uVar1;
                auVar27._0_4_ = uVar1;
                auVar27._8_4_ = uVar1;
                auVar27._12_4_ = uVar1;
                auVar27._16_4_ = uVar1;
                auVar27._20_4_ = uVar1;
                auVar27._24_4_ = uVar1;
                auVar27._28_4_ = uVar1;
                uVar1 = *(undefined4 *)(uVar10 + 0x40 + uVar11 * 4);
                auVar25._4_4_ = uVar1;
                auVar25._0_4_ = uVar1;
                auVar25._8_4_ = uVar1;
                auVar25._12_4_ = uVar1;
                auVar25._16_4_ = uVar1;
                auVar25._20_4_ = uVar1;
                auVar25._24_4_ = uVar1;
                auVar25._28_4_ = uVar1;
                auVar23 = *(undefined1 (*) [32])(ray + 0xe0);
                uVar1 = *(undefined4 *)(uVar10 + 0x140 + uVar11 * 4);
                auVar35._4_4_ = uVar1;
                auVar35._0_4_ = uVar1;
                auVar35._8_4_ = uVar1;
                auVar35._12_4_ = uVar1;
                auVar35._16_4_ = uVar1;
                auVar35._20_4_ = uVar1;
                auVar35._24_4_ = uVar1;
                auVar35._28_4_ = uVar1;
                auVar19 = vfmadd231ps_fma(auVar25,auVar23,auVar27);
                uVar1 = *(undefined4 *)(uVar10 + 0x80 + uVar11 * 4);
                auVar31._4_4_ = uVar1;
                auVar31._0_4_ = uVar1;
                auVar31._8_4_ = uVar1;
                auVar31._12_4_ = uVar1;
                auVar31._16_4_ = uVar1;
                auVar31._20_4_ = uVar1;
                auVar31._24_4_ = uVar1;
                auVar31._28_4_ = uVar1;
                auVar3 = vfmadd231ps_fma(auVar31,auVar23,auVar35);
                uVar1 = *(undefined4 *)(uVar10 + 0x180 + uVar11 * 4);
                auVar28._4_4_ = uVar1;
                auVar28._0_4_ = uVar1;
                auVar28._8_4_ = uVar1;
                auVar28._12_4_ = uVar1;
                auVar28._16_4_ = uVar1;
                auVar28._20_4_ = uVar1;
                auVar28._24_4_ = uVar1;
                auVar28._28_4_ = uVar1;
                uVar1 = *(undefined4 *)(uVar10 + 0xc0 + uVar11 * 4);
                auVar36._4_4_ = uVar1;
                auVar36._0_4_ = uVar1;
                auVar36._8_4_ = uVar1;
                auVar36._12_4_ = uVar1;
                auVar36._16_4_ = uVar1;
                auVar36._20_4_ = uVar1;
                auVar36._24_4_ = uVar1;
                auVar36._28_4_ = uVar1;
                uVar1 = *(undefined4 *)(uVar10 + 0x120 + uVar11 * 4);
                auVar38._4_4_ = uVar1;
                auVar38._0_4_ = uVar1;
                auVar38._8_4_ = uVar1;
                auVar38._12_4_ = uVar1;
                auVar38._16_4_ = uVar1;
                auVar38._20_4_ = uVar1;
                auVar38._24_4_ = uVar1;
                auVar38._28_4_ = uVar1;
                uVar1 = *(undefined4 *)(uVar10 + 0x60 + uVar11 * 4);
                auVar40._4_4_ = uVar1;
                auVar40._0_4_ = uVar1;
                auVar40._8_4_ = uVar1;
                auVar40._12_4_ = uVar1;
                auVar40._16_4_ = uVar1;
                auVar40._20_4_ = uVar1;
                auVar40._24_4_ = uVar1;
                auVar40._28_4_ = uVar1;
                auVar33 = vfmadd231ps_fma(auVar36,auVar23,auVar28);
                auVar7 = vfmadd231ps_fma(auVar40,auVar23,auVar38);
                uVar1 = *(undefined4 *)(uVar10 + 0x160 + uVar11 * 4);
                auVar29._4_4_ = uVar1;
                auVar29._0_4_ = uVar1;
                auVar29._8_4_ = uVar1;
                auVar29._12_4_ = uVar1;
                auVar29._16_4_ = uVar1;
                auVar29._20_4_ = uVar1;
                auVar29._24_4_ = uVar1;
                auVar29._28_4_ = uVar1;
                uVar1 = *(undefined4 *)(uVar10 + 0xa0 + uVar11 * 4);
                auVar39._4_4_ = uVar1;
                auVar39._0_4_ = uVar1;
                auVar39._8_4_ = uVar1;
                auVar39._12_4_ = uVar1;
                auVar39._16_4_ = uVar1;
                auVar39._20_4_ = uVar1;
                auVar39._24_4_ = uVar1;
                auVar39._28_4_ = uVar1;
                uVar1 = *(undefined4 *)(uVar10 + 0x1a0 + uVar11 * 4);
                auVar42._4_4_ = uVar1;
                auVar42._0_4_ = uVar1;
                auVar42._8_4_ = uVar1;
                auVar42._12_4_ = uVar1;
                auVar42._16_4_ = uVar1;
                auVar42._20_4_ = uVar1;
                auVar42._24_4_ = uVar1;
                auVar42._28_4_ = uVar1;
                auVar5 = vfmadd231ps_fma(auVar39,auVar23,auVar29);
                uVar1 = *(undefined4 *)(uVar10 + 0xe0 + uVar11 * 4);
                auVar43._4_4_ = uVar1;
                auVar43._0_4_ = uVar1;
                auVar43._8_4_ = uVar1;
                auVar43._12_4_ = uVar1;
                auVar43._16_4_ = uVar1;
                auVar43._20_4_ = uVar1;
                auVar43._24_4_ = uVar1;
                auVar43._28_4_ = uVar1;
                auVar6 = vfmadd231ps_fma(auVar43,auVar23,auVar42);
                auVar9._4_4_ = fStack_587c;
                auVar9._0_4_ = local_5880;
                auVar9._8_4_ = fStack_5878;
                auVar9._12_4_ = fStack_5874;
                auVar9._16_4_ = fStack_5870;
                auVar9._20_4_ = fStack_586c;
                auVar9._24_4_ = fStack_5868;
                auVar9._28_4_ = uStack_5864;
                auVar19 = vfmadd213ps_fma(ZEXT1632(auVar19),local_5900,auVar9);
                auVar8._4_4_ = fStack_589c;
                auVar8._0_4_ = local_58a0;
                auVar8._8_4_ = fStack_5898;
                auVar8._12_4_ = fStack_5894;
                auVar8._16_4_ = fStack_5890;
                auVar8._20_4_ = fStack_588c;
                auVar8._24_4_ = fStack_5888;
                auVar8._28_4_ = uStack_5884;
                auVar3 = vfmadd213ps_fma(ZEXT1632(auVar3),local_5940,auVar8);
                auVar4._4_4_ = fStack_58bc;
                auVar4._0_4_ = local_58c0;
                auVar4._8_4_ = fStack_58b8;
                auVar4._12_4_ = fStack_58b4;
                auVar4._16_4_ = fStack_58b0;
                auVar4._20_4_ = fStack_58ac;
                auVar4._24_4_ = fStack_58a8;
                auVar4._28_4_ = uStack_58a4;
                auVar33 = vfmadd213ps_fma(ZEXT1632(auVar33),local_5920,auVar4);
                auVar7 = vfmadd213ps_fma(ZEXT1632(auVar7),local_5900,auVar9);
                auVar5 = vfmadd213ps_fma(ZEXT1632(auVar5),local_5940,auVar8);
                auVar6 = vfmadd213ps_fma(ZEXT1632(auVar6),local_5920,auVar4);
                auVar4 = vpminsd_avx2(ZEXT1632(auVar19),ZEXT1632(auVar7));
                auVar21 = vpminsd_avx2(ZEXT1632(auVar3),ZEXT1632(auVar5));
                auVar4 = vpmaxsd_avx2(auVar4,auVar21);
                auVar21 = vpminsd_avx2(ZEXT1632(auVar33),ZEXT1632(auVar6));
                auVar21 = vpmaxsd_avx2(auVar4,auVar21);
                auVar4 = vpmaxsd_avx2(ZEXT1632(auVar19),ZEXT1632(auVar7));
                auVar30 = vpmaxsd_avx2(ZEXT1632(auVar3),ZEXT1632(auVar5));
                auVar30 = vpminsd_avx2(auVar4,auVar30);
                auVar4 = vpmaxsd_avx2(ZEXT1632(auVar33),ZEXT1632(auVar6));
                auVar4 = vpminsd_avx2(auVar4,local_5960);
                auVar30 = vpminsd_avx2(auVar30,auVar4);
                auVar4 = vpmaxsd_avx2(auVar21,local_5860);
                auVar4 = vcmpps_avx(auVar4,auVar30,2);
                if ((uVar14 & 7) == 6) {
                  uVar1 = *(undefined4 *)(uVar10 + 0x1c0 + uVar11 * 4);
                  auVar32._4_4_ = uVar1;
                  auVar32._0_4_ = uVar1;
                  auVar32._8_4_ = uVar1;
                  auVar32._12_4_ = uVar1;
                  auVar32._16_4_ = uVar1;
                  auVar32._20_4_ = uVar1;
                  auVar32._24_4_ = uVar1;
                  auVar32._28_4_ = uVar1;
                  auVar30 = vcmpps_avx(auVar32,auVar23,2);
                  uVar1 = *(undefined4 *)(uVar10 + 0x1e0 + uVar11 * 4);
                  auVar37._4_4_ = uVar1;
                  auVar37._0_4_ = uVar1;
                  auVar37._8_4_ = uVar1;
                  auVar37._12_4_ = uVar1;
                  auVar37._16_4_ = uVar1;
                  auVar37._20_4_ = uVar1;
                  auVar37._24_4_ = uVar1;
                  auVar37._28_4_ = uVar1;
                  auVar23 = vcmpps_avx(auVar23,auVar37,1);
                  auVar23 = vandps_avx(auVar30,auVar23);
                  auVar23 = vandps_avx(auVar23,auVar4);
                  auVar19 = vpackssdw_avx(auVar23._0_16_,auVar23._16_16_);
                }
                else {
                  auVar19 = vpackssdw_avx(auVar4._0_16_,auVar4._16_16_);
                }
                auVar23 = vcmpps_avx(local_5960,auVar18,6);
                auVar3 = vpackssdw_avx(auVar23._0_16_,auVar23._16_16_);
                auVar19 = vpand_avx(auVar19,auVar3);
                auVar23 = vpmovzxwd_avx2(auVar19);
                auVar23 = vpslld_avx2(auVar23,0x1f);
                auVar24 = ZEXT3264(auVar23);
                if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar23 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar23 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar23 >> 0x7f,0) != '\0') ||
                      (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar23 >> 0xbf,0) != '\0') ||
                    (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar23[0x1f] < '\0') {
                  auVar26._8_4_ = 0x7f800000;
                  auVar26._0_8_ = 0x7f8000007f800000;
                  auVar26._12_4_ = 0x7f800000;
                  auVar26._16_4_ = 0x7f800000;
                  auVar26._20_4_ = 0x7f800000;
                  auVar26._24_4_ = 0x7f800000;
                  auVar26._28_4_ = 0x7f800000;
                  auVar23 = vblendvps_avx(auVar26,auVar21,auVar23);
                  auVar24 = ZEXT3264(auVar23);
                  if (uVar15 != 8) {
                    *puVar12 = uVar15;
                    puVar12 = puVar12 + 1;
                    *pauVar13 = auVar20._0_32_;
                    pauVar13 = pauVar13 + 1;
                  }
                  auVar20 = ZEXT3264(auVar23);
                  uVar15 = uVar2;
                }
              }
            } while ((uVar2 != 8) && (bVar16 = uVar11 < 7, uVar11 = uVar11 + 1, bVar16));
            auVar18 = auVar20._0_32_;
          } while (uVar15 != 8);
        }
        bVar17 = false;
      }
      goto LAB_0069fb65;
    }
  }
  return;
  while( true ) {
    prim = prim + 1;
    bVar17 = local_59b0 <= local_59b8;
    local_59b8 = local_59b8 + 1;
    if (bVar17) break;
LAB_0069fbdb:
    InstanceIntersectorKMB<8>::occluded
              ((vbool<8> *)&local_5840.field_1,(vbool<8> *)&local_5980.field_1,&local_59c1,ray,
               local_59a8,prim);
    aVar22.v = (__m256)vandnps_avx(local_5840.v,local_5980.v);
    auVar18 = (undefined1  [32])local_5980 & ~(undefined1  [32])local_5840;
    local_5980 = aVar22;
    if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar18 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar18 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar18 >> 0x7f,0) == '\0') &&
          (auVar18 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar18 >> 0xbf,0) == '\0') &&
        (auVar18 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar18[0x1f])
    break;
  }
LAB_0069fc39:
  auVar18 = vpcmpeqd_avx2((undefined1  [32])aVar22,(undefined1  [32])aVar22);
  auVar24 = ZEXT3264(auVar18);
  local_59a0 = vpor_avx2(local_59a0,auVar18 ^ (undefined1  [32])local_5980);
  auVar18 = auVar18 & ~local_59a0;
  if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
           (auVar18 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar18 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         SUB321(auVar18 >> 0x7f,0) == '\0') &&
        (auVar18 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
       SUB321(auVar18 >> 0xbf,0) == '\0') &&
      (auVar18 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar18[0x1f]) {
    auVar45 = ZEXT3264(local_5900);
    auVar46 = ZEXT3264(local_5920);
    auVar47 = ZEXT3264(local_5940);
    auVar44 = ZEXT3264(local_5960);
    bVar17 = true;
  }
  else {
    auVar18._8_4_ = 0xff800000;
    auVar18._0_8_ = 0xff800000ff800000;
    auVar18._12_4_ = 0xff800000;
    auVar18._16_4_ = 0xff800000;
    auVar18._20_4_ = 0xff800000;
    auVar18._24_4_ = 0xff800000;
    auVar18._28_4_ = 0xff800000;
    auVar18 = vblendvps_avx(local_5960,auVar18,local_59a0);
    auVar44 = ZEXT3264(auVar18);
    bVar17 = false;
    auVar45 = ZEXT3264(local_5900);
    auVar46 = ZEXT3264(local_5920);
    auVar47 = ZEXT3264(local_5940);
  }
LAB_0069fb65:
  if (bVar17) {
    auVar18 = vandps_avx(local_58e0,local_59a0);
    auVar23._8_4_ = 0xff800000;
    auVar23._0_8_ = 0xff800000ff800000;
    auVar23._12_4_ = 0xff800000;
    auVar23._16_4_ = 0xff800000;
    auVar23._20_4_ = 0xff800000;
    auVar23._24_4_ = 0xff800000;
    auVar23._28_4_ = 0xff800000;
    auVar18 = vmaskmovps_avx(auVar18,auVar23);
    *(undefined1 (*) [32])local_59c0 = auVar18;
    return;
  }
  goto LAB_0069f928;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }